

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

void __thiscall luna::Table::MergeFromHashToArray(Table *this)

{
  vector<luna::Value,_std::allocator<luna::Value>_> *pvVar1;
  bool bVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  anon_union_8_9_8deb4486_for_Value_0 local_28;
  undefined4 local_20;
  
  pvVar1 = (this->array_)._M_t.
           super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
           .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>.
           _M_head_impl;
  if (pvVar1 == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0) {
    lVar3 = 1;
  }
  else {
    lVar3 = ((long)*(pointer *)
                    ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                            _M_impl + 8) -
             *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                       _M_impl >> 4) + 1;
  }
  auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  local_28.num_ =
       (auVar4._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  local_20 = 2;
  while( true ) {
    lVar3 = lVar3 + 1;
    bVar2 = MoveHashToArray(this,(Value *)&local_28);
    if (!bVar2) break;
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    local_28.num_ =
         (auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  }
  return;
}

Assistant:

void Table::MergeFromHashToArray()
    {
        auto index = ArraySize();
        Value key;
        key.num_ = ++index;
        key.type_ = ValueT_Number;

        while (MoveHashToArray(key))
            key.num_ = ++index;
    }